

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

wchar_t tty_rawmode(EditLine *el)

{
  wchar_t wVar1;
  speed_t sVar2;
  wchar_t local_1c;
  wchar_t i;
  EditLine *el_local;
  
  if (((el->el_tty).t_mode == '\x01') || ((el->el_tty).t_mode == '\x02')) {
    el_local._4_4_ = L'\0';
  }
  else if ((el->el_flags & 4U) == 0) {
    wVar1 = tty_getty(el,&(el->el_tty).t_ts);
    if (wVar1 == L'\xffffffff') {
      el_local._4_4_ = L'\xffffffff';
    }
    else {
      (el->el_tty).t_eight = (uint)(((el->el_tty).t_ts.c_cflag & 0x30) == 0x30);
      sVar2 = tty__getspeed(&(el->el_tty).t_ts);
      (el->el_tty).t_speed = sVar2;
      sVar2 = tty__getspeed(&(el->el_tty).t_ex);
      if ((sVar2 != (el->el_tty).t_speed) ||
         (sVar2 = tty__getspeed(&(el->el_tty).t_ed), sVar2 != (el->el_tty).t_speed)) {
        cfsetispeed((termios *)&(el->el_tty).t_ex,(el->el_tty).t_speed);
        cfsetospeed((termios *)&(el->el_tty).t_ex,(el->el_tty).t_speed);
        cfsetispeed((termios *)&(el->el_tty).t_ed,(el->el_tty).t_speed);
        cfsetospeed((termios *)&(el->el_tty).t_ed,(el->el_tty).t_speed);
      }
      if (((el->el_tty).t_ts.c_lflag & 2) != 0) {
        for (local_1c = L'\0'; local_1c < L'\x04'; local_1c = local_1c + L'\x01') {
          tty_update_flags(el,local_1c);
        }
        if (((el->el_tty).t_ex.c_oflag & 0x1800) == 0x1800) {
          (el->el_tty).t_tabs = L'\0';
        }
        else {
          (el->el_tty).t_tabs = (uint)(((el->el_terminal).t_flags & 8U) != 0);
        }
        tty__getchar(&(el->el_tty).t_ts,(el->el_tty).t_c[2]);
        for (local_1c = 0;
            (local_1c < 0x19 && ((el->el_tty).t_c[2][local_1c] == (el->el_tty).t_c[0][local_1c]));
            local_1c = local_1c + 1) {
        }
        if (local_1c != 0x19) {
          for (local_1c = L'\0'; local_1c < L'\x19'; local_1c = local_1c + L'\x01') {
            tty_update_char(el,L'\x01',local_1c);
          }
          tty_bind_char(el,L'\0');
          tty__setchar(&(el->el_tty).t_ed,(el->el_tty).t_c[1]);
          for (local_1c = L'\0'; local_1c < L'\x19'; local_1c = local_1c + L'\x01') {
            tty_update_char(el,L'\0',local_1c);
          }
          tty__setchar(&(el->el_tty).t_ex,(el->el_tty).t_c[0]);
        }
      }
      wVar1 = tty_setty(el,L'\x01',&(el->el_tty).t_ed);
      if (wVar1 == L'\xffffffff') {
        el_local._4_4_ = L'\xffffffff';
      }
      else {
        (el->el_tty).t_mode = '\x01';
        el_local._4_4_ = L'\0';
      }
    }
  }
  else {
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
tty_rawmode(EditLine *el)
{

	if (el->el_tty.t_mode == ED_IO || el->el_tty.t_mode == QU_IO)
		return 0;

	if (el->el_flags & EDIT_DISABLED)
		return 0;

	if (tty_getty(el, &el->el_tty.t_ts) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_getty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	/*
         * We always keep up with the eight bit setting and the speed of the
         * tty. But we only believe changes that are made to cooked mode!
         */
	el->el_tty.t_eight = tty__geteightbit(&el->el_tty.t_ts);
	el->el_tty.t_speed = tty__getspeed(&el->el_tty.t_ts);

	if (tty__getspeed(&el->el_tty.t_ex) != el->el_tty.t_speed ||
	    tty__getspeed(&el->el_tty.t_ed) != el->el_tty.t_speed) {
		(void) cfsetispeed(&el->el_tty.t_ex, el->el_tty.t_speed);
		(void) cfsetospeed(&el->el_tty.t_ex, el->el_tty.t_speed);
		(void) cfsetispeed(&el->el_tty.t_ed, el->el_tty.t_speed);
		(void) cfsetospeed(&el->el_tty.t_ed, el->el_tty.t_speed);
	}
	if (tty__cooked_mode(&el->el_tty.t_ts)) {
		int i;

		for (i = MD_INP; i <= MD_LIN; i++)
			tty_update_flags(el, i);

		if (tty__gettabs(&el->el_tty.t_ex) == 0)
			el->el_tty.t_tabs = 0;
		else
			el->el_tty.t_tabs = EL_CAN_TAB ? 1 : 0;

		tty__getchar(&el->el_tty.t_ts, el->el_tty.t_c[TS_IO]);
		/*
		 * Check if the user made any changes.
		 * If he did, then propagate the changes to the
		 * edit and execute data structures.
		 */
		for (i = 0; i < C_NCC; i++)
			if (el->el_tty.t_c[TS_IO][i] !=
			    el->el_tty.t_c[EX_IO][i])
				break;

		if (i != C_NCC) {
			/*
			 * Propagate changes only to the unlibedit_private
			 * chars that have been modified just now.
			 */
			for (i = 0; i < C_NCC; i++)
				tty_update_char(el, ED_IO, i);

			tty_bind_char(el, 0);
			tty__setchar(&el->el_tty.t_ed, el->el_tty.t_c[ED_IO]);

			for (i = 0; i < C_NCC; i++)
				tty_update_char(el, EX_IO, i);

			tty__setchar(&el->el_tty.t_ex, el->el_tty.t_c[EX_IO]);
		}
	}
	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_ed) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = ED_IO;
	return 0;
}